

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_AddTxOut_RemoveTxOut_Test::~Transaction_AddTxOut_RemoveTxOut_Test
          (Transaction_AddTxOut_RemoveTxOut_Test *this)

{
  Transaction_AddTxOut_RemoveTxOut_Test *this_local;
  
  ~Transaction_AddTxOut_RemoveTxOut_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Transaction, AddTxOut_RemoveTxOut) {
  Transaction tx(exp_version, exp_locktime);
  Script script("76a9143f1f881ea0e079888a8a9d65025aacf6b98f853588ac");

  EXPECT_NO_THROW(tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script));
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW(tx.GetTxOut(0));
  EXPECT_EQ(0, tx.GetTxOutIndex(script));

  EXPECT_NO_THROW(tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script));
  EXPECT_EQ(tx.GetTxOutCount(), 2);
  EXPECT_NO_THROW(tx.GetTxOut(1));
  EXPECT_EQ(0, tx.GetTxOutIndex(script));
  std::vector<uint32_t> index_list;
  EXPECT_NO_THROW((index_list = tx.GetTxOutIndexList(script)));
  EXPECT_EQ(2, index_list.size());
  if (index_list.size() == 2) {
    EXPECT_EQ(0, index_list[0]);
    EXPECT_EQ(1, index_list[1]);
  }

  // SetTxOutValue (address duplex)
  Amount amt2 = Amount::CreateBySatoshiAmount(7654321);
  TxOutReference txout_ref;
  EXPECT_NO_THROW(tx.SetTxOutValue(1, amt2));
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(1)));
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(),
            amt2.GetSatoshiValue());

  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  EXPECT_EQ(tx.GetTxOutCount(), 0);
  EXPECT_THROW(tx.GetTxOut(0), CfdException);
}